

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O2

void record_token_rgb(float *r,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  float fVar1;
  
  fVar1 = std::__cxx11::stof((tokens->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
  *r = fVar1;
  fVar1 = std::__cxx11::stof((tokens->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0);
  r[1] = fVar1;
  fVar1 = std::__cxx11::stof((tokens->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0);
  r[2] = fVar1;
  return;
}

Assistant:

void record_token_rgb(vec3 r, const vector<string> tokens){
    r[0] = stof(tokens[1]);
    r[1] = stof(tokens[2]);
    r[2] = stof(tokens[3]);
}